

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,int,std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  idx_t i;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  UnifiedVectorFormat sdata;
  long *local_68;
  long local_60;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar2 = duckdb::ListVector::GetListSize(result);
  lVar6 = 0;
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if (*local_68 != 0) {
      iVar5 = (idx_t)*(uint *)(*local_68 + iVar4 * 4);
    }
    lVar3 = **(long **)(local_60 + iVar5 * 8);
    if (lVar3 != 0) {
      lVar6 = lVar6 + *(long *)(lVar3 + 0x18);
    }
  }
  duckdb::ListVector::Reserve(result,lVar6 + uVar2);
  lVar3 = duckdb::ListVector::GetEntry(result);
  lVar6 = *(long *)(result + 0x20);
  for (iVar4 = 0; iVar4 != count; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if (*local_68 != 0) {
      iVar5 = (idx_t)*(uint *)(*local_68 + iVar4 * 4);
    }
    plVar8 = *(long **)(local_60 + iVar5 * 8);
    *(ulong *)(lVar6 + iVar4 * 0x10) = uVar2;
    lVar7 = *plVar8;
    if (lVar7 == 0) {
      lVar7 = 0;
    }
    else {
      plVar8 = (long *)(lVar7 + 0x10);
      lVar1 = *(long *)(lVar3 + 0x20);
      lVar7 = 0;
      while (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0) {
        *(undefined4 *)(uVar2 * 4 + lVar1 + lVar7 * 4) = *(undefined4 *)(plVar8 + 1);
        lVar7 = lVar7 + 1;
      }
      uVar2 = uVar2 + lVar7;
    }
    *(long *)(iVar4 * 0x10 + lVar6 + 8) = lVar7;
  }
  duckdb::ListVector::SetListSize(result,uVar2);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}